

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCombinedCase::runComputeShader
          (ComputeShaderGeneratedCombinedCase *this)

{
  ostringstream *poVar1;
  DrawMethod DVar2;
  int i;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  uint *puVar7;
  byte bVar8;
  int size;
  int size_00;
  int size_01;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  IVec3 dispatchSize;
  IVec3 indexBufferDispatchSize;
  IVec3 commandDispatchSize;
  IVec3 dataBufferDispatchSize;
  Vector<int,_3> res;
  IVec3 drawArraysDataBufferDispatchSize;
  IVec3 drawElementsDataBufferDispatchSize;
  string local_218;
  Vector<int,_3> local_1f8;
  int local_1e8 [6];
  undefined8 local_1d0;
  uint local_1c8;
  undefined1 local_1c0 [384];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint uStack_30;
  uint local_2c;
  long lVar5;
  
  iVar3 = (*((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  bVar11 = (this->super_ComputeShaderGeneratedCase).m_computeCmd;
  local_1e8[3] = (int)bVar11;
  if (local_1e8[3] != 0) {
    local_1e8[3] = (this->super_ComputeShaderGeneratedCase).m_numDrawCmds;
  }
  local_1e8[4] = (uint)bVar11;
  local_1e8[5] = (uint)bVar11;
  bVar11 = (this->super_ComputeShaderGeneratedCase).m_computeData;
  local_2c = (uint)bVar11;
  local_34 = (this->super_ComputeShaderGeneratedCase).m_gridSize + 1;
  if (bVar11 == false) {
    local_34 = (uint)bVar11;
  }
  uStack_30 = local_34;
  local_40 = (this->super_ComputeShaderGeneratedCase).m_gridSize;
  if (bVar11 == false) {
    local_40 = local_2c;
  }
  bVar11 = (this->super_ComputeShaderGeneratedCase).m_drawMethod == DRAWMETHOD_DRAWELEMENTS;
  local_3c = local_40;
  local_38 = local_2c;
  puVar7 = &local_40;
  if (bVar11) {
    puVar7 = &local_34;
  }
  lVar6 = 0;
  local_1e8[0] = 0;
  bVar8 = bVar11 & (this->super_ComputeShaderGeneratedCase).m_computeIndices;
  if (bVar8 != 0) {
    local_1e8[0] = (this->super_ComputeShaderGeneratedCase).m_gridSize;
  }
  local_1e8[1] = local_1e8[0];
  local_1e8[2] = (uint)bVar8;
  local_1c8 = puVar7[2];
  local_1d0 = *(undefined8 *)puVar7;
  local_1c0._8_4_ = 0;
  local_1c0._0_8_ = (TestLog *)0x0;
  do {
    iVar3 = *(int *)((long)&local_1d0 + lVar6 * 4);
    if (iVar3 < local_1e8[lVar6 + 3]) {
      iVar3 = local_1e8[lVar6 + 3];
    }
    *(int *)(local_1c0 + lVar6 * 4) = iVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_1f8.m_data[2] = 0;
  local_1f8.m_data[0] = 0;
  local_1f8.m_data[1] = 0;
  lVar6 = 0;
  do {
    iVar3 = local_1e8[lVar6];
    if (local_1e8[lVar6] < *(int *)(local_1c0 + lVar6 * 4)) {
      iVar3 = *(int *)(local_1c0 + lVar6 * 4);
    }
    local_1f8.m_data[lVar6] = iVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  (**(code **)(lVar5 + 0x1680))((this->m_computeProgram->m_program).m_program);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"use compute shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x665);
  if ((this->super_ComputeShaderGeneratedCase).m_computeCmd == true) {
    uVar9 = (this->super_ComputeShaderGeneratedCase).m_numDrawCmds *
            (this->super_ComputeShaderGeneratedCase).m_commandSize;
    local_1c0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Binding command buffer to binding point ",0x28);
    std::ostream::operator<<(poVar1,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
    (**(code **)(lVar5 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_cmdBufferID);
    local_1c0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Allocating memory for command buffer, size ",0x2b);
    (anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_218,(_anonymous_namespace_ *)(ulong)uVar9,size);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
    (**(code **)(lVar5 + 0x150))(0x90d2,(long)(int)uVar9,0);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeData == true) {
    DVar2 = (this->super_ComputeShaderGeneratedCase).m_drawMethod;
    if (DVar2 == DRAWMETHOD_DRAWELEMENTS) {
      iVar3 = (this->super_ComputeShaderGeneratedCase).m_gridSize + 1;
      iVar3 = iVar3 * iVar3 * 4;
    }
    else {
      iVar3 = 0;
      if (DVar2 == DRAWMETHOD_DRAWARRAYS) {
        iVar3 = (this->super_ComputeShaderGeneratedCase).m_gridSize;
        iVar3 = iVar3 * iVar3 * 0xc;
      }
    }
    bVar11 = (this->super_ComputeShaderGeneratedCase).m_computeCmd;
    local_1c0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Binding data buffer to binding point ",0x25);
    std::ostream::operator<<(poVar1,(uint)bVar11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
    (**(code **)(lVar5 + 0x48))
              (0x90d2,bVar11,(this->super_ComputeShaderGeneratedCase).m_dataBufferID);
    local_1c0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Allocating memory for data buffer, size ",0x28);
    (anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_218,(_anonymous_namespace_ *)(ulong)(uint)(iVar3 << 4),size_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
    (**(code **)(lVar5 + 0x150))(0x90d2,(long)(iVar3 << 4),0);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeIndices == true) {
    bVar11 = (this->super_ComputeShaderGeneratedCase).m_computeCmd;
    if ((bVar11 != true) ||
       (uVar9 = 2, (this->super_ComputeShaderGeneratedCase).m_computeData == false)) {
      uVar9 = 1;
      if (bVar11 == false) {
        uVar9 = (uint)(this->super_ComputeShaderGeneratedCase).m_computeData;
      }
    }
    iVar3 = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    uVar10 = iVar3 * iVar3 * 0x18;
    if ((this->super_ComputeShaderGeneratedCase).m_drawMethod != DRAWMETHOD_DRAWELEMENTS) {
      uVar10 = 0;
    }
    local_1c0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Binding index buffer to binding point ",0x26);
    std::ostream::operator<<(poVar1,uVar9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
    (**(code **)(lVar5 + 0x48))
              (0x90d2,uVar9,(this->super_ComputeShaderGeneratedCase).m_indexBufferID);
    local_1c0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Allocating memory for index buffer, size ",0x29);
    (anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_218,(_anonymous_namespace_ *)(ulong)uVar10,size_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
    (**(code **)(lVar5 + 0x150))(0x90d2,(long)(int)uVar10,0,0x88e8);
  }
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"setup buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x68d);
  local_1c0._0_8_ =
       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Dispatching compute, size = ",0x1c);
  tcu::operator<<((ostream *)poVar1,&local_1f8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
  (**(code **)(lVar5 + 0x528))
            (local_1f8.m_data._0_8_ & 0xffffffff,local_1f8.m_data[1],local_1f8.m_data[2]);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"calculate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x694);
  return;
}

Assistant:

void ComputeShaderGeneratedCombinedCase::runComputeShader (void)
{
	const glw::Functions&	gl									= m_context.getRenderContext().getFunctions();
	const bool				indexed								= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS);
	const tcu::IVec3		nullSize							(0, 0, 0);
	const tcu::IVec3		commandDispatchSize					= (m_computeCmd)				? (tcu::IVec3(m_numDrawCmds, 1, 1))				: (nullSize);
	const tcu::IVec3		drawElementsDataBufferDispatchSize	= (m_computeData)				? (tcu::IVec3(m_gridSize+1, m_gridSize+1, 1))	: (nullSize);
	const tcu::IVec3		drawArraysDataBufferDispatchSize	= (m_computeData)				? (tcu::IVec3(m_gridSize,   m_gridSize,   1))	: (nullSize);
	const tcu::IVec3		indexBufferDispatchSize				= (m_computeIndices && indexed)	? (tcu::IVec3(m_gridSize,   m_gridSize,   1))	: (nullSize);

	const tcu::IVec3		dataBufferDispatchSize				= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS) ? (drawElementsDataBufferDispatchSize) : (drawArraysDataBufferDispatchSize);
	const tcu::IVec3		dispatchSize						= tcu::max(tcu::max(commandDispatchSize, dataBufferDispatchSize), indexBufferDispatchSize);

	gl.useProgram(m_computeProgram->getProgram());
	glu::checkError(gl.getError(), "use compute shader", __FILE__, __LINE__);

	// setup buffers

	if (m_computeCmd)
	{
		const int			bindingPoint	= 0;
		const int			bufferSize		= m_commandSize * m_numDrawCmds;

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding command buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_cmdBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for command buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	if (m_computeData)
	{
		const int			bindingPoint	= (m_computeCmd) ? (1) : (0);
		const int			bufferSize		= (int)(calcDrawBufferSize()*sizeof(tcu::Vec4));

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding data buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_dataBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for data buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	if (m_computeIndices)
	{
		const int			bindingPoint	= (m_computeCmd && m_computeData) ? (2) : (m_computeCmd || m_computeData) ? (1) : (0);
		const int			bufferSize		= (int)(calcIndexBufferSize()*sizeof(deUint32));

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding index buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_indexBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for index buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	glu::checkError(gl.getError(), "setup buffers", __FILE__, __LINE__);

	// calculate

	m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching compute, size = " << dispatchSize << tcu::TestLog::EndMessage;
	gl.dispatchCompute(dispatchSize.x(), dispatchSize.y(), dispatchSize.z());

	glu::checkError(gl.getError(), "calculate", __FILE__, __LINE__);
}